

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

TPZFMatrix<long_double> * __thiscall
TPZFMatrix<long_double>::operator=(TPZFMatrix<long_double> *this,TPZMatrix<long_double> *A)

{
  undefined1 auVar1 [16];
  int64_t iVar2;
  int64_t iVar3;
  ulong uVar4;
  longdouble *plVar5;
  TPZBaseMatrix *in_RSI;
  TPZFMatrix<long_double> *in_RDI;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  int64_t r;
  int64_t c;
  longdouble *dst;
  int64_t size;
  int64_t acols;
  int64_t arows;
  long local_40;
  long local_38;
  longdouble *local_30;
  
  iVar2 = TPZBaseMatrix::Rows(in_RSI);
  iVar3 = TPZBaseMatrix::Cols(in_RSI);
  if (in_RDI->fElem != in_RDI->fGiven) {
    if (in_RDI->fElem != (longdouble *)0x0) {
      operator_delete__(in_RDI->fElem);
    }
    in_RDI->fElem = (longdouble *)0x0;
  }
  (in_RDI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = iVar2;
  (in_RDI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = iVar3;
  if (in_RDI->fSize < iVar2 * iVar3) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = iVar2 * iVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(0x10),0);
    if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    plVar5 = (longdouble *)operator_new__(uVar4);
    in_RDI->fElem = plVar5;
  }
  else {
    in_RDI->fElem = in_RDI->fGiven;
  }
  local_30 = in_RDI->fElem;
  for (local_38 = 0; local_38 < (in_RDI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
      local_38 = local_38 + 1) {
    for (local_40 = 0; local_40 < (in_RDI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
        local_40 = local_40 + 1) {
      (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RSI,local_40,local_38);
      *local_30 = in_ST0;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = in_ST6;
      in_ST6 = in_ST7;
      local_30 = local_30 + 1;
    }
  }
  return in_RDI;
}

Assistant:

TPZFMatrix<TVar> &TPZFMatrix<TVar>::operator=(const TPZMatrix<TVar> &A ) {
    int64_t arows  = A.Rows();
    int64_t acols  = A.Cols();
    int64_t size = arows * acols;
    if(fElem != fGiven) {
        delete []fElem;
        fElem = 0;
    }
    this->fRow  =  arows;
    this->fCol  = acols;
    if(fSize < size) {
        fElem = new TVar[ arows * acols ] ;
    } else {
        fElem = fGiven;
    }
    TVar * dst = fElem;
    for ( int64_t c = 0; c < this->fCol; c++ )
        for ( int64_t r = 0; r < this->fRow; r++ )
            *dst++ = A.Get( r, c );
    return( *this );
}